

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::ShaderResourceBindingBase
          (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,ResourceSignatureType *pPRS)

{
  PIPELINE_TYPE PVar1;
  Uint32 UVar2;
  SHADER_TYPE ShaderType_00;
  reference pvVar3;
  IMemoryAllocator *Allocator;
  ShaderVariableManagerVk *pSVar4;
  Char *pCVar5;
  SRBMemoryAllocator *this_00;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *Args_1;
  undefined1 local_112 [8];
  SHADER_RESOURCE_VARIABLE_TYPE VarTypes [2];
  IMemoryAllocator *VarDataAllocator;
  string msg_1;
  int MgrInd;
  Int32 ShaderInd_1;
  SHADER_TYPE ShaderType_1;
  Uint32 s_1;
  SRBMemoryAllocator *SRBMemAllocator;
  string msg;
  void *Ptr;
  reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>_> local_a0;
  undefined1 local_98 [8];
  FixedLinearAllocator MemPool;
  Int32 ShaderInd;
  SHADER_TYPE ShaderType;
  Uint32 s;
  PIPELINE_TYPE PipelineType;
  Uint32 NumShaders;
  value_type_conflict3 local_21;
  PipelineResourceSignatureVkImpl *local_20;
  ResourceSignatureType *pPRS_local;
  IReferenceCounters *pRefCounters_local;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_20 = pPRS;
  pPRS_local = (ResourceSignatureType *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IShaderResourceBindingVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IShaderResourceBindingVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderResourceBindingVk>).
  super_RefCountedObject<Diligent::IShaderResourceBindingVk>.super_IShaderResourceBindingVk.
  super_IShaderResourceBinding.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_010d4d70;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr(&this->m_pPRS,local_20);
  (this->m_ActiveShaderStageIndex)._M_elems[0] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[1] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[2] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[3] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[4] = -1;
  (this->m_ActiveShaderStageIndex)._M_elems[5] = -1;
  ShaderResourceCacheVk::ShaderResourceCacheVk(&this->m_ShaderResourceCache,SRB);
  this->m_pShaderVarMgrs = (ShaderVariableManagerImplType *)0x0;
  this->m_bStaticResourcesInitialized = false;
  local_21 = -1;
  std::array<signed_char,_6UL>::fill(&this->m_ActiveShaderStageIndex,&local_21);
  UVar2 = GetNumShaders(this);
  PVar1 = GetPipelineType(this);
  for (ShaderInd = 0; (uint)ShaderInd < UVar2; ShaderInd = ShaderInd + 1) {
    MemPool._76_4_ =
         PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                   (&local_20->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                    ShaderInd);
    MemPool._72_4_ = GetShaderTypePipelineIndex(MemPool._76_4_,PVar1);
    pvVar3 = std::array<signed_char,_6UL>::operator[]
                       (&this->m_ActiveShaderStageIndex,(long)(int)MemPool._72_4_);
    *pvVar3 = (value_type_conflict3)ShaderInd;
  }
  Allocator = GetRawAllocator();
  FixedLinearAllocator::FixedLinearAllocator((FixedLinearAllocator *)local_98,Allocator);
  FixedLinearAllocator::AddSpace<Diligent::ShaderVariableManagerVk>
            ((FixedLinearAllocator *)local_98,(ulong)UVar2);
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)local_98);
  local_a0 = std::ref<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>>(this);
  Ptr = (void *)std::ref<Diligent::ShaderResourceCacheVk>(&this->m_ShaderResourceCache);
  pSVar4 = FixedLinearAllocator::
           ConstructArray<Diligent::ShaderVariableManagerVk,std::reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineVkImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheVk>>
                     ((FixedLinearAllocator *)local_98,(ulong)UVar2,&local_a0,
                      (reference_wrapper<Diligent::ShaderResourceCacheVk> *)&Ptr);
  this->m_pShaderVarMgrs = pSVar4;
  msg.field_2._8_8_ = FixedLinearAllocator::ReleaseOwnership((FixedLinearAllocator *)local_98);
  Args_1 = this;
  if ((ShaderVariableManagerImplType *)msg.field_2._8_8_ != this->m_pShaderVarMgrs) {
    FormatString<char[26],char[24]>
              ((string *)&SRBMemAllocator,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pShaderVarMgrs",(char (*) [24])this);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)0x67;
    DebugAssertionFailed
              (pCVar5,"ShaderResourceBindingBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
               ,0x67);
    std::__cxx11::string::~string((string *)&SRBMemAllocator);
  }
  PipelineResourceSignatureVkImpl::InitSRBResourceCache(local_20,&this->m_ShaderResourceCache);
  this_00 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetSRBMemoryAllocator
                      (&local_20->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>)
  ;
  for (ShaderInd_1 = 0; (uint)ShaderInd_1 < UVar2; ShaderInd_1 = ShaderInd_1 + 1) {
    ShaderType_00 =
         PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                   (&local_20->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                    ShaderInd_1);
    PVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetPipelineType
                      (&local_20->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>)
    ;
    msg_1.field_2._12_4_ = GetShaderTypePipelineIndex(ShaderType_00,PVar1);
    pvVar3 = std::array<signed_char,_6UL>::operator[]
                       (&this->m_ActiveShaderStageIndex,(long)(int)msg_1.field_2._12_4_);
    msg_1.field_2._8_4_ = SEXT14(*pvVar3);
    if (((int)msg_1.field_2._8_4_ < 0) || ((int)UVar2 <= (int)msg_1.field_2._8_4_)) {
      FormatString<char[26],char[53]>
                ((string *)&VarDataAllocator,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders)",
                 (char (*) [53])Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"ShaderResourceBindingBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                 ,0x75);
      std::__cxx11::string::~string((string *)&VarDataAllocator);
    }
    register0x00000000 = SRBMemoryAllocator::GetShaderVariableDataAllocator(this_00,ShaderInd_1);
    local_112._0_2_ = 0x201;
    Args_1 = (ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *)local_112;
    ShaderVariableManagerVk::Initialize
              (this->m_pShaderVarMgrs + (int)msg_1.field_2._8_4_,local_20,register0x00000000,
               (SHADER_RESOURCE_VARIABLE_TYPE *)Args_1,2,ShaderType_00);
  }
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)local_98);
  return;
}

Assistant:

ShaderResourceBindingBase(IReferenceCounters* pRefCounters, ResourceSignatureType* pPRS) :
        TObjectBase{pRefCounters},
        m_pPRS{pPRS},
        m_ShaderResourceCache{ResourceCacheContentType::SRB}
    {
        try
        {
            m_ActiveShaderStageIndex.fill(-1);

            const Uint32        NumShaders   = GetNumShaders();
            const PIPELINE_TYPE PipelineType = GetPipelineType();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, PipelineType);

                m_ActiveShaderStageIndex[ShaderInd] = static_cast<Int8>(s);
            }


            FixedLinearAllocator MemPool{GetRawAllocator()};
            MemPool.AddSpace<ShaderVariableManagerImplType>(NumShaders);
            MemPool.Reserve();
            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all managers");
            m_pShaderVarMgrs = MemPool.ConstructArray<ShaderVariableManagerImplType>(NumShaders, std::ref(*this), std::ref(m_ShaderResourceCache));

            // The memory is now owned by ShaderResourceBindingBase and will be freed by Destruct().
            void* Ptr = MemPool.ReleaseOwnership();
            VERIFY_EXPR(Ptr == m_pShaderVarMgrs);
            (void)Ptr;

            // It is important to construct all objects before initializing them because if an exception is thrown,
            // Destruct() will call destructors for all non-null objects.

            pPRS->InitSRBResourceCache(m_ShaderResourceCache);

            SRBMemoryAllocator& SRBMemAllocator = pPRS->GetSRBMemoryAllocator();
            for (Uint32 s = 0; s < NumShaders; ++s)
            {
                const SHADER_TYPE ShaderType = pPRS->GetActiveShaderStageType(s);
                const Int32       ShaderInd  = GetShaderTypePipelineIndex(ShaderType, pPRS->GetPipelineType());
                const int         MgrInd     = m_ActiveShaderStageIndex[ShaderInd];
                VERIFY_EXPR(MgrInd >= 0 && MgrInd < static_cast<int>(NumShaders));

                IMemoryAllocator& VarDataAllocator = SRBMemAllocator.GetShaderVariableDataAllocator(s);

                // Initialize vars manager to reference mutable and dynamic variables
                // Note that the cache has space for all variable types
                const SHADER_RESOURCE_VARIABLE_TYPE VarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                m_pShaderVarMgrs[MgrInd].Initialize(*pPRS, VarDataAllocator, VarTypes, _countof(VarTypes), ShaderType);
            }
        }
        catch (...)
        {
            // We must release objects manually as destructor will not be called.
            Destruct();
            throw;
        }
    }